

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gz_zero(gz_state *state,off64_t len)

{
  off64_t *poVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong __n;
  
  if (((state->strm).avail_in != 0) && (iVar3 = gz_comp(state,0), iVar3 == -1)) {
    return -1;
  }
  if (len != 0) {
    bVar2 = false;
    do {
      uVar4 = (uint)len;
      if ((long)(ulong)state->size <= len) {
        uVar4 = state->size;
      }
      __n = (ulong)uVar4;
      if (!bVar2) {
        memset(state->in,0,__n);
      }
      (state->strm).avail_in = uVar4;
      (state->strm).next_in = state->in;
      poVar1 = &(state->x).pos;
      *poVar1 = *poVar1 + __n;
      iVar3 = gz_comp(state,0);
      if (iVar3 == -1) {
        return -1;
      }
      bVar2 = true;
      len = len - __n;
    } while (len != 0);
  }
  return 0;
}

Assistant:

static int gz_zero(gz_state *state, z_off64_t len) {
    int first;
    unsigned n;
    PREFIX3(stream) *strm = &(state->strm);

    /* consume whatever's left in the input buffer */
    if (strm->avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
        return -1;

    /* compress len zeros (len guaranteed > 0) */
    first = 1;
    while (len) {
        n = GT_OFF(state->size) || (z_off64_t)state->size > len ? (unsigned)len : state->size;
        if (first) {
            memset(state->in, 0, n);
            first = 0;
        }
        strm->avail_in = n;
        strm->next_in = state->in;
        state->x.pos += n;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return -1;
        len -= n;
    }
    return 0;
}